

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Empty.hpp
# Opt level: O0

IsEmpty * __thiscall
ut11::Operands::IsEmpty::GetErrorMessage<char[3]>(IsEmpty *this,char (*actual) [3])

{
  ostream *poVar1;
  char (*in_RDX) [3];
  utility local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream errorMessage;
  ostream local_198 [376];
  char (*local_20) [3];
  char (*actual_local) [3];
  IsEmpty *this_local;
  
  local_20 = in_RDX;
  actual_local = actual;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"Expected empty but was ");
  utility::ToString<char[3]>(local_1d8,local_20);
  std::operator<<(poVar1,(string *)local_1d8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

inline std::string GetErrorMessage(const U& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected empty but was " << utility::ToString(actual);
				return errorMessage.str();
			}